

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

void cs_impl::list_cs_ext::push_back(list *lst,var *val)

{
  value_type vStack_18;
  any local_10;
  
  local_10.mDat = val->mDat;
  if (local_10.mDat != (proxy *)0x0) {
    (local_10.mDat)->refcount = (local_10.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&vStack_18,(EVP_PKEY_CTX *)&local_10);
  std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back(lst,&vStack_18);
  any::recycle(&vStack_18);
  any::recycle(&local_10);
  return;
}

Assistant:

void push_back(list &lst, const var &val)
		{
			lst.push_back(copy(val));
		}